

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  WirePointer *pWVar1;
  Reader reader;
  uint local_2dc;
  Fault f_1;
  StructDataBitCount local_2b8;
  ListElementCount local_29c;
  Builder root;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1c>_> list;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&reader,&builder.super_MessageBuilder);
  list.builder.ptr = (byte *)reader._reader.data;
  list.builder.segment = (SegmentBuilder *)reader._reader.segment;
  list.builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&list,(StructSize)0x10000);
  reader._reader.segment = &(root._builder.segment)->super_SegmentReader;
  reader._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  reader._reader.data = root._builder.pointers;
  PointerBuilder::initStructList(&list.builder,(PointerBuilder *)&reader,4,(StructSize)0x10001);
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,0);
  *(byte *)reader._reader.data = *reader._reader.data | 1;
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,1);
  *(byte *)reader._reader.data = *reader._reader.data & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,2);
  *(byte *)reader._reader.data = *reader._reader.data | 1;
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,3);
  *(byte *)reader._reader.data = *reader._reader.data | 1;
  reader._reader.segment = (SegmentReader *)&PTR_run_0036b790;
  reader._reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&list,(Runnable *)&reader);
  if ((char)list.builder.segment == '\x01') {
    kj::Exception::~Exception((Exception *)&list.builder.capTable);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d2,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  reader._reader.segment = &(root._builder.segment)->super_SegmentReader;
  reader._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  reader._reader.data = root._builder.pointers;
  PointerBuilder::getStructList(&list.builder,(PointerBuilder *)&reader,(StructSize)0x1,(word *)0x0)
  ;
  if (list.builder.elementCount != 4) {
    f_1.exception._0_4_ = 4;
    local_2dc = list.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&reader,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d6,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&f_1,&local_2dc);
    kj::_::Debug::Fault::fatal((Fault *)&reader);
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,0);
  if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d7,ERROR,"\"failed: expected \" \"l[0].getF()\"",
               (char (*) [29])"failed: expected l[0].getF()");
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,1);
  if (((*reader._reader.data & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d8,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
               (char (*) [32])"failed: expected !(l[1].getF())");
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,2);
  if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d9,ERROR,"\"failed: expected \" \"l[2].getF()\"",
               (char (*) [29])"failed: expected l[2].getF()");
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,3);
  if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2da,ERROR,"\"failed: expected \" \"l[3].getF()\"",
               (char (*) [29])"failed: expected l[3].getF()");
  }
  StructBuilder::asReader(&root._builder);
  f_1.exception = (Exception *)&PTR_run_0036b7c0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&list,(Runnable *)&f_1);
  if ((char)list.builder.segment == '\x01') {
    kj::Exception::~Exception((Exception *)&list.builder.capTable);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2df,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  pWVar1 = (WirePointer *)0x0;
  if (reader._reader.pointerCount != 0) {
    pWVar1 = reader._reader.pointers;
  }
  f_1.exception._0_4_ = 0;
  f_1.exception._4_4_ = 0;
  if (reader._reader.pointerCount != 0) {
    f_1.exception._0_4_ = reader._reader.segment._0_4_;
    f_1.exception._4_4_ = reader._reader.segment._4_4_;
  }
  PointerReader::getList((ListReader *)&list,(PointerReader *)&f_1,INLINE_COMPOSITE,(word *)0x0);
  if (list.builder.elementCount == 4) {
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,0);
    if (((local_2b8 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e4,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,1);
    if (((local_2b8 != 0) && (((pWVar1->offsetAndKind).value & 1) != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e5,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,2);
    if (((local_2b8 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e6,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,3);
    if (((local_2b8 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e7,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
    }
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_2dc = 4;
  local_29c = list.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&f_1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x2e3,FAILED,"(4u) == (l.size())","4u, l.size()",&local_2dc,&local_29c);
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

TEST(Encoding, BitListDowngradeFromStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  {
    auto list = root.getAnyPointerField().initAs<List<test::TestLists::Struct1c>>(4);
    list[0].setF(true);
    list[1].setF(false);
    list[2].setF(true);
    list[3].setF(true);
  }

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  auto reader = root.asReader();

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }
}